

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O2

void us_internal_loop_update_pending_ready_polls
               (us_loop_t *loop,us_poll_t *old_poll,us_poll_t *new_poll,int old_events,
               int new_events)

{
  int iVar1;
  us_poll_t *puVar2;
  bool bVar3;
  long lVar4;
  epoll_data_t *peVar5;
  
  lVar4 = (long)loop->current_ready_poll;
  iVar1 = loop->num_ready_polls;
  peVar5 = &loop->ready_polls[lVar4].data;
  bVar3 = true;
  for (; (bVar3 && (lVar4 < iVar1)); lVar4 = lVar4 + 1) {
    puVar2 = (us_poll_t *)peVar5->ptr;
    if (puVar2 == old_poll) {
      peVar5->ptr = new_poll;
    }
    bVar3 = puVar2 != old_poll;
    peVar5 = (epoll_data_t *)((long)peVar5 + 0xc);
  }
  return;
}

Assistant:

void us_internal_loop_update_pending_ready_polls(struct us_loop_t *loop, struct us_poll_t *old_poll, struct us_poll_t *new_poll, int old_events, int new_events) {
#ifdef LIBUS_USE_EPOLL
    /* Epoll only has one ready poll per poll */
    int num_entries_possibly_remaining = 1;
#else
    /* Ready polls may contain same poll twice under kqueue, as one poll may hold two filters */
    int num_entries_possibly_remaining = 2;//((old_events & LIBUS_SOCKET_READABLE) ? 1 : 0) + ((old_events & LIBUS_SOCKET_WRITABLE) ? 1 : 0);
#endif

    /* Todo: for kqueue if we track things in us_change_poll it is possible to have a fast path with no seeking in cases of:
    * current poll being us AND we only poll for one thing */

    for (int i = loop->current_ready_poll; i < loop->num_ready_polls && num_entries_possibly_remaining; i++) {
        if (GET_READY_POLL(loop, i) == old_poll) {

            // if new events does not contain the ready events of this poll then remove (no we filter that out later on)
            SET_READY_POLL(loop, i, new_poll);

            num_entries_possibly_remaining--;
        }
    }
}